

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cc
# Opt level: O0

int fast_relay_test(int mode)

{
  ThreadPoolMgr *this;
  size_type sVar1;
  int __how;
  int __fd;
  ThreadPoolOptions *ctx;
  int in_EDI;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint64_t elapsed_us;
  size_t ii;
  FastRelayCtx relay_ctx;
  Timer tt;
  ThreadPoolMgr mgr;
  ThreadPoolOptions opt;
  size_t in_stack_fffffffffffffd18;
  ThreadPoolMgr *in_stack_fffffffffffffd20;
  FastRelayCtx *in_stack_fffffffffffffd30;
  ThreadPoolMgr *pTVar4;
  TaskResult local_2c8;
  TaskResult local_2c4;
  Timer *in_stack_fffffffffffffd40;
  TaskResult *in_stack_fffffffffffffdb0;
  ThreadPoolMgr *in_stack_fffffffffffffdb8;
  FastRelayCtx *in_stack_fffffffffffffdc0;
  ThreadPoolOptions local_200 [2];
  ThreadPoolOptions local_20;
  int local_4;
  
  local_4 = in_EDI;
  simple_thread_pool::ThreadPoolOptions::ThreadPoolOptions(&local_20);
  local_20.numInitialThreads = 2;
  if (local_4 == 1) {
    local_20.activeWorkerMode = false;
  }
  else if (local_4 == 2) {
    local_20.activeWorkerMode = true;
  }
  simple_thread_pool::ThreadPoolMgr::ThreadPoolMgr(in_stack_fffffffffffffd20);
  ctx = &local_20;
  simple_thread_pool::ThreadPoolMgr::init((ThreadPoolMgr *)local_200,(EVP_PKEY_CTX *)ctx);
  TestSuite::_msgt("begin\n");
  TestSuite::Timer::Timer((Timer *)in_stack_fffffffffffffd20);
  FastRelayCtx::FastRelayCtx(in_stack_fffffffffffffd30);
  if (local_4 == 0) {
    for (in_stack_fffffffffffffd40 = (Timer *)0x0; __fd = (int)ctx,
        in_stack_fffffffffffffd40 < (Timer *)0xf4240;
        in_stack_fffffffffffffd40 = (Timer *)((long)&(in_stack_fffffffffffffd40->start).__d.__r + 1)
        ) {
      simple_thread_pool::TaskResult::TaskResult(&local_2c4);
      ctx = local_200;
      fast_relay_func(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0)
      ;
    }
  }
  else {
    simple_thread_pool::TaskResult::TaskResult(&local_2c8);
    fast_relay_func(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
    __fd = 3000;
    simple_thread_pool::EventAwaiter::wait_ms
              ((EventAwaiter *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  }
  this = (ThreadPoolMgr *)TestSuite::Timer::getTimeUs(in_stack_fffffffffffffd40);
  pTVar4 = this;
  sVar1 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::size
                    ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *
                     )0x10512c);
  auVar2._8_4_ = (int)(sVar1 >> 0x20);
  auVar2._0_8_ = sVar1;
  auVar2._12_4_ = 0x45300000;
  auVar3._8_4_ = (int)((ulong)pTVar4 >> 0x20);
  auVar3._0_8_ = pTVar4;
  auVar3._12_4_ = 0x45300000;
  TestSuite::_msgt((char *)((((auVar2._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) *
                            1000000.0) /
                           ((auVar3._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)pTVar4) - 4503599627370496.0))),
                   "%.1f executions/s");
  simple_thread_pool::ThreadPoolMgr::shutdown((ThreadPoolMgr *)local_200,__fd,__how);
  FastRelayCtx::~FastRelayCtx((FastRelayCtx *)this);
  simple_thread_pool::ThreadPoolMgr::~ThreadPoolMgr(this);
  return 0;
}

Assistant:

int fast_relay_test(int mode) {
    ThreadPoolOptions opt;
    opt.numInitialThreads = 2;
    if (mode == 1) {
        opt.activeWorkerMode = false;
    } else if (mode == 2) {
        opt.activeWorkerMode = true;
    }

    // Initialize thread pool.
    ThreadPoolMgr mgr;
    mgr.init(opt);

    TestSuite::_msgt("begin\n");
    TestSuite::Timer tt;

    FastRelayCtx relay_ctx;
    if (mode == 0) {
        relay_ctx.asyncScheduleNext = false;
        for (size_t ii = 0; ii < 1000000; ++ii) {
            fast_relay_func(&relay_ctx, &mgr, TaskResult());
        }
    } else {
        // Fire timer task.
        fast_relay_func(&relay_ctx, &mgr, TaskResult());
        // Wait 3 seconds.
        relay_ctx.ea.wait_ms(3000);
    }

    uint64_t elapsed_us = tt.getTimeUs();
    TestSuite::_msgt("%.1f executions/s",
                     relay_ctx.storage.size() * 1000000.0 / elapsed_us);

    // Shutdown thread pool.
    mgr.shutdown();
    return 0;
}